

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::NamedBase::AddDescriptionPostfix
          (NamedBase *this,string *dest,bool isManual,string *manual,bool isGenerated,
          string *generated,string *str)

{
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,isManual) == 0) {
    if (!isGenerated) {
      return;
    }
  }
  else {
    if (manual->_M_string_length != 0) goto LAB_00139ba8;
    if (!isGenerated || isManual) {
      return;
    }
  }
  manual = generated;
  if (generated->_M_string_length == 0) {
    return;
  }
LAB_00139ba8:
  std::__cxx11::string::_M_append((char *)dest,(ulong)(str->_M_dataplus)._M_p);
  std::__cxx11::string::_M_append((char *)dest,(ulong)(manual->_M_dataplus)._M_p);
  return;
}

Assistant:

void AddDescriptionPostfix(std::string &dest, const bool isManual, const std::string &manual, bool isGenerated, const std::string &generated, const std::string &str) const
            {
                if (isManual && !manual.empty())
                {
                    dest += str;
                    dest += manual;
                }
                else if (!isManual && isGenerated && !generated.empty())
                {
                    dest += str;
                    dest += generated;
                }
            }